

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O3

void __thiscall QInputDialogPrivate::chooseRightTextInputWidget(QInputDialogPrivate *this)

{
  bool bVar1;
  int iVar2;
  QPlainTextEdit **ppQVar3;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->comboBox == (QComboBox *)0x0) {
LAB_004fe62e:
    if (((this->opts).super_QFlagsStorageHelper<QInputDialog::InputDialogOption,_4>.
         super_QFlagsStorage<QInputDialog::InputDialogOption>.i & 4) == 0) {
      ensureLineEdit(this);
      ppQVar3 = (QPlainTextEdit **)&this->lineEdit;
    }
    else {
      ensurePlainTextEdit(this);
      ppQVar3 = &this->plainTextEdit;
    }
  }
  else {
    iVar2 = QComboBox::count(this->comboBox);
    if (iVar2 < 1) goto LAB_004fe62e;
    ppQVar3 = (QPlainTextEdit **)&this->comboBox;
    if (((this->opts).super_QFlagsStorageHelper<QInputDialog::InputDialogOption,_4>.
         super_QFlagsStorage<QInputDialog::InputDialogOption>.i & 2) != 0) {
      bVar1 = QComboBox::isEditable((QComboBox *)*ppQVar3);
      if (!bVar1) {
        ensureListView(this);
        ppQVar3 = (QPlainTextEdit **)&this->listView;
      }
    }
  }
  setInputWidget(this,(QWidget *)*ppQVar3);
  if (this->inputWidget == &this->comboBox->super_QWidget) {
    QComboBox::currentText(&local_30,(QComboBox *)&this->comboBox->super_QWidget);
  }
  else {
    if (this->inputWidget != (QWidget *)this->listView) goto LAB_004fe6c9;
    listViewText(&local_30,this);
  }
  textChanged(this,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_004fe6c9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QInputDialogPrivate::chooseRightTextInputWidget()
{
    QWidget *widget;

    if (useComboBoxOrListView()) {
        if ((opts & QInputDialog::UseListViewForComboBoxItems) && !comboBox->isEditable()) {
            ensureListView();
            widget = listView;
        } else {
            widget = comboBox;
        }
    } else if (opts & QInputDialog::UsePlainTextEditForTextInput) {
        ensurePlainTextEdit();
        widget = plainTextEdit;
    } else {
        ensureLineEdit();
        widget = lineEdit;
    }

    setInputWidget(widget);

    if (inputWidget == comboBox) {
        textChanged(comboBox->currentText());
    } else if (inputWidget == listView) {
        textChanged(listViewText());
    }
}